

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData *
cfd::core::CryptoUtil::EncryptAes256Cbc
          (ByteData *__return_storage_ptr__,ByteData *key,ByteData *iv,ByteData *data)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CfdException *pCVar4;
  allocator local_b1;
  undefined1 local_b0 [36];
  int ret;
  size_t written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  
  sVar3 = ByteData::GetDataSize(key);
  if (sVar3 != 0x20) {
    local_b0._0_8_ = "cfdcore_util.cpp";
    local_b0._8_4_ = 0x29e;
    local_b0._16_8_ = "EncryptAes256Cbc";
    logger::warn<>((CfdSourceLocation *)local_b0,"wally_aes key size NG.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_b0,"EncryptAes256Cbc key size error.",(allocator *)&output);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_b0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ByteData::IsEmpty(data);
  if (!bVar1) {
    sVar3 = ByteData::GetDataSize(data);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&output,(sVar3 & 0xfffffffffffffff0) + 0x10,(allocator_type *)local_b0);
    ByteData::GetBytes(&key_data,key);
    ByteData::GetBytes(&iv_data,iv);
    written = 0;
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,data);
    sVar3 = ByteData::GetDataSize(data);
    iVar2 = wally_aes_cbc(key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)key_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)key_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                          iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)iv_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)iv_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(uchar *)local_b0._0_8_,
                          sVar3,1,output.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                          (long)output.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)output.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,&written);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    ret = iVar2;
    if (iVar2 == 0) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&output,written);
      ByteData::ByteData(__return_storage_ptr__,&output);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return __return_storage_ptr__;
    }
    local_b0._0_8_ = "cfdcore_util.cpp";
    local_b0._8_4_ = 0x2b6;
    local_b0._16_8_ = "EncryptAes256Cbc";
    logger::warn<int&>((CfdSourceLocation *)local_b0,"wally_aes_cbc NG[{}].",&ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_b0,"EncryptAes256Cbc error.",&local_b1);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_b0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_b0._0_8_ = "cfdcore_util.cpp";
  local_b0._8_4_ = 0x2a4;
  local_b0._16_8_ = "EncryptAes256Cbc";
  logger::warn<>((CfdSourceLocation *)local_b0,"wally_aes data is Empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_b0,"EncryptAes256Cbc data isEmpty.",(allocator *)&output);
  CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_b0);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::EncryptAes256Cbc(
    const ByteData &key, const ByteData &iv, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc key size error.");
  }

  if (data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "wally_aes data is Empty.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc data isEmpty.");
  }

  size_t data_size =
      (((data.GetDataSize() / kAesBlockLength) + 1) * kAesBlockLength);
  std::vector<uint8_t> output(data_size);
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> iv_data = iv.GetBytes();
  size_t written = 0;

  // Encrypt data using AES(CBC mode, PKCS#7 padding).
  int ret = wally_aes_cbc(
      key_data.data(), key_data.size(), iv_data.data(), iv_data.size(),
      data.GetBytes().data(), data.GetDataSize(), AES_FLAG_ENCRYPT,
      output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes_cbc NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256Cbc error.");
  }

  output.resize(written);
  return ByteData(output);
}